

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_AssignmentViaSetInline_Test::
TestBody(MicroStringPrevTest_AssignmentViaSetInline_Test *this)

{
  Arena *pAVar1;
  MicroString *this_00;
  ParamType *pPVar2;
  MicroString MVar3;
  size_t sVar4;
  Arena *pAVar5;
  char *pcVar6;
  MicroString source;
  size_t used;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string_view local_50;
  string_view local_40;
  MicroString local_30;
  size_t local_28;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  pAVar1 = &(this->super_MicroStringPrevTest).arena_;
  pAVar5 = (Arena *)0x0;
  if ((pPVar2->
      super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
      ).super__Head_base<0UL,_bool,_false>._M_head_impl != false) {
    pAVar5 = pAVar1;
  }
  MVar3 = MicroStringPrevTest::MakeFromState(kInline,pAVar5);
  local_30 = MVar3;
  local_28 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  this_00 = &(this->super_MicroStringPrevTest).str_;
  pPVar2 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  if (((*(uint *)&(this->super_MicroStringPrevTest).str_.rep_ | (uint)MVar3.rep_) & 3) == 0) {
    this_00->rep_ = MVar3.rep_;
  }
  else {
    pAVar5 = (Arena *)0x0;
    if ((pPVar2->
        super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
        ).super__Head_base<0UL,_bool,_false>._M_head_impl != false) {
      pAVar5 = pAVar1;
    }
    MicroString::SetFromOtherSlow(this_00,&local_30,pAVar5,7);
  }
  local_50 = MicroString::Get(this_00);
  local_40 = MicroString::Get(&local_30);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (local_60,"str_.Get()","source.Get()",&local_50,&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x2cf,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_50._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_len + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  sVar4 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  local_50._M_len = sVar4;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_60,"used","arena_space_used()",&local_28,&local_50._M_len);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x2d1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_50._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_len + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, AssignmentViaSetInline) {
  MicroString source = MakeFromState(kInline, arena());
  size_t used = arena_space_used();
  str_.Set(source, arena());
  EXPECT_EQ(str_.Get(), source.Get());
  // No new memory should be used.
  EXPECT_EQ(used, arena_space_used());
}